

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O1

void __thiscall CountOverJoin::run(CountOverJoin *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unsigned_long uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  uint uVar4;
  char cVar5;
  FactorisedJoin *__tmp;
  element_type *peVar6;
  long lVar7;
  long *plVar8;
  uint *__s;
  ostream *poVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  long *plVar11;
  ulong uVar12;
  long lVar13;
  char cVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  string __str;
  long *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint local_34;
  
  Launcher::getAggregateEngine
            ((this->_launcher).super___shared_ptr<Launcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (local_98 == (long *)0x0) {
    peVar6 = (element_type *)0x0;
  }
  else {
    peVar6 = (element_type *)__dynamic_cast(local_98,&Engine::typeinfo,&FactorisedJoin::typeinfo);
  }
  if (peVar6 == (element_type *)0x0) {
    p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar6 = (element_type *)0x0;
  }
  else {
    p_Var10 = local_90;
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_90->_M_use_count = local_90->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_90->_M_use_count = local_90->_M_use_count + 1;
      }
    }
  }
  (this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6
  ;
  this_00 = (this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var10;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  lVar7 = std::chrono::_V2::system_clock::now();
  lVar13 = SUB168(SEXT816(lVar7) * SEXT816(-0x431bde82d7b634db),8);
  FactorisedJoin::run((this->_joinEngine).
                      super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  this->rootNode =
       ((this->_joinEngine).super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       rootNode;
  lVar7 = std::chrono::_V2::system_clock::now();
  uVar16 = lVar7 / 1000000 + ((lVar13 >> 0x12) - (lVar13 >> 0x3f));
  uVar18 = -uVar16;
  if (0 < (long)uVar16) {
    uVar18 = uVar16;
  }
  uVar15 = 1;
  if (9 < uVar18) {
    uVar17 = uVar18;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      if (uVar17 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_0012c369;
      }
      if (uVar17 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_0012c369;
      }
      if (uVar17 < 10000) goto LAB_0012c369;
      bVar3 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      uVar4 = uVar15 + 4;
    } while (bVar3);
    uVar15 = uVar15 + 1;
  }
LAB_0012c369:
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)uVar15 - (char)((long)uVar16 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_58._M_dataplus._M_p + -((long)uVar16 >> 0x3f),uVar15,uVar18);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x139663);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_68 = *plVar11;
    lStack_60 = plVar8[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar11;
    local_78 = (long *)*plVar8;
  }
  local_70 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_98 = &local_88;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_88 = *plVar11;
    lStack_80 = plVar8[3];
  }
  else {
    local_88 = *plVar11;
    local_98 = (long *)*plVar8;
  }
  lVar7 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_98,lVar7);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  lVar7 = std::chrono::_V2::system_clock::now();
  lVar13 = SUB168(SEXT816(lVar7) * SEXT816(-0x431bde82d7b634db),8);
  uVar16 = (ulong)((((this->_joinEngine).
                     super___shared_ptr<FactorisedJoin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    numberOfCachedValues & 0xffff) << 2);
  __s = (uint *)operator_new__(uVar16);
  memset(__s,0,uVar16);
  this->cachedCounts = __s;
  local_34 = count(this,this->rootNode,
                   ((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _root);
  lVar7 = std::chrono::_V2::system_clock::now();
  uVar17 = lVar7 / 1000000 + ((lVar13 >> 0x12) - (lVar13 >> 0x3f));
  uVar18 = -uVar17;
  if (0 < (long)uVar17) {
    uVar18 = uVar17;
  }
  uVar15 = 1;
  if (9 < uVar18) {
    uVar12 = uVar18;
    uVar4 = 4;
    do {
      uVar15 = uVar4;
      if (uVar12 < 100) {
        uVar15 = uVar15 - 2;
        goto LAB_0012c58e;
      }
      if (uVar12 < 1000) {
        uVar15 = uVar15 - 1;
        goto LAB_0012c58e;
      }
      if (uVar12 < 10000) goto LAB_0012c58e;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      uVar4 = uVar15 + 4;
    } while (bVar3);
    uVar15 = uVar15 + 1;
  }
LAB_0012c58e:
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,(char)uVar15 - (char)((long)uVar17 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_58._M_dataplus._M_p + -((long)uVar17 >> 0x3f),uVar15,uVar18);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x139680);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_68 = *plVar11;
    lStack_60 = plVar8[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar11;
    local_78 = (long *)*plVar8;
  }
  paVar1 = &local_58.field_2;
  local_70 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_88 = *plVar11;
    lStack_80 = plVar8[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar11;
    local_98 = (long *)*plVar8;
  }
  lVar7 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_98,lVar7);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this->numberOfValues = 0;
  memset(this->cachedCounts,0,uVar16);
  valueCount(this,this->rootNode,
             ((this->_dTree).super___shared_ptr<DTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root);
  uVar18 = this->numberOfValues;
  cVar14 = '\x01';
  if (9 < uVar18) {
    uVar16 = uVar18;
    cVar5 = '\x04';
    do {
      cVar14 = cVar5;
      if (uVar16 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0012c74a;
      }
      if (uVar16 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0012c74a;
      }
      if (uVar16 < 10000) goto LAB_0012c74a;
      bVar3 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar5 = cVar14 + '\x04';
    } while (bVar3);
    cVar14 = cVar14 + '\x01';
  }
LAB_0012c74a:
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_58,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_58._M_dataplus._M_p,(uint)local_58._M_string_length,uVar18);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x13969d);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_68 = *plVar11;
    lStack_60 = plVar8[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar11;
    local_78 = (long *)*plVar8;
  }
  local_70 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_88 = *plVar11;
    lStack_80 = plVar8[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar11;
    local_98 = (long *)*plVar8;
  }
  lVar7 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_98,lVar7);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  uVar18 = dfdb::params::NUM_OF_ATTRIBUTES * (ulong)local_34;
  cVar14 = '\x01';
  if (9 < uVar18) {
    uVar16 = uVar18;
    cVar5 = '\x04';
    do {
      cVar14 = cVar5;
      if (uVar16 < 100) {
        cVar14 = cVar14 + -2;
        goto LAB_0012c8cb;
      }
      if (uVar16 < 1000) {
        cVar14 = cVar14 + -1;
        goto LAB_0012c8cb;
      }
      if (uVar16 < 10000) goto LAB_0012c8cb;
      bVar3 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar5 = cVar14 + '\x04';
    } while (bVar3);
    cVar14 = cVar14 + '\x01';
  }
LAB_0012c8cb:
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_58,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_58._M_dataplus._M_p,(uint)local_58._M_string_length,uVar18);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x1396d4);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_68 = *plVar11;
    lStack_60 = plVar8[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar11;
    local_78 = (long *)*plVar8;
  }
  local_70 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_88 = *plVar11;
    lStack_80 = plVar8[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar11;
    local_98 = (long *)*plVar8;
  }
  lVar7 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_98,lVar7);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  auVar19._8_4_ = (int)(uVar18 >> 0x20);
  auVar19._0_8_ = uVar18;
  auVar19._12_4_ = 0x45300000;
  uVar2 = this->numberOfValues;
  auVar20._8_4_ = (int)(uVar2 >> 0x20);
  auVar20._0_8_ = uVar2;
  auVar20._12_4_ = 0x45300000;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_58,vsnprintf,0x148,"%f",
             ((auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) /
             ((auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x139708);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_68 = *plVar11;
    lStack_60 = plVar8[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar11;
    local_78 = (long *)*plVar8;
  }
  local_70 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_88 = *plVar11;
    lStack_80 = plVar8[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar11;
    local_98 = (long *)*plVar8;
  }
  lVar7 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)local_98,lVar7);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DATA - Number of Tuples in join result: ",0x28);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return;
}

Assistant:

void CountOverJoin::run() 
{
    _joinEngine =
        std::dynamic_pointer_cast<FactorisedJoin>(_launcher->getAggregateEngine());

#ifdef BENCH
    int64_t startJoin = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
#endif

    _joinEngine->run();

    rootNode = _joinEngine->getFactorisationRoot();

    BINFO(
        "WORKER - join construction: " + std::to_string(
            duration_cast<milliseconds>(
                system_clock::now().time_since_epoch()).count() - startJoin
            ) + "ms.\n"
        );

    DINFO("WORKER - join has been constructed. \n");

#ifdef BENCH
    int64_t startCount = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch()).count();
#endif

    unsigned short numberOfCachedValues = _joinEngine->getNumberOfCachedValues();

    cachedCounts = new unsigned int[numberOfCachedValues]();

    unsigned int tupleCount = count(rootNode, _dTree->_root); 

    BINFO(
        "WORKER - count calculation: " + std::to_string(
            duration_cast<milliseconds>(
                system_clock::now().time_since_epoch()).count() - startCount) +
        "ms.\n");


    numberOfValues = 0;
    memset(cachedCounts, 0, numberOfCachedValues * sizeof(unsigned int));
    valueCount(rootNode, _dTree->_root);

    // std::cout << "Number of cached values: "+std::to_string(numberOfCachedValues)+"\n";
    std::cout << "DATA - Number of values in Factorised Representation: "+ std::to_string(numberOfValues) +".\n";

    size_t flatValueCount = ((size_t)tupleCount) * dfdb::params::NUM_OF_ATTRIBUTES;
    std::cout << "DATA - Number of values in Listing Representation: "+std::to_string(flatValueCount)+".\n"; 

    std::cout << "DATA - Compression Factor: "+ std::to_string((double)flatValueCount / numberOfValues)+".\n";

    assert(tupleCount == rootNode -> count);

    std::cout << "DATA - Number of Tuples in join result: " <<
        (size_t) tupleCount << std::endl;
    // exit(0);
}